

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particles.c
# Opt level: O2

void usage(void)

{
  puts("Usage: particles [-bfhs]");
  puts("Options:");
  puts(" -f   Run in full screen");
  puts(" -h   Display this help");
  puts(" -s   Run program as single thread (default is to use two threads)");
  putchar(10);
  puts("Program runtime controls:");
  puts(" W    Toggle wireframe mode");
  puts(" Esc  Exit program");
  return;
}

Assistant:

static void usage(void)
{
    printf("Usage: particles [-bfhs]\n");
    printf("Options:\n");
    printf(" -f   Run in full screen\n");
    printf(" -h   Display this help\n");
    printf(" -s   Run program as single thread (default is to use two threads)\n");
    printf("\n");
    printf("Program runtime controls:\n");
    printf(" W    Toggle wireframe mode\n");
    printf(" Esc  Exit program\n");
}